

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifUtil.c
# Opt level: O2

float If_ManMarkMapping_rec(If_Man_t *p,If_Obj_t *pObj)

{
  int iVar1;
  If_LibLut_t *pIVar2;
  uint uVar3;
  If_Obj_t *pObj_00;
  ulong uVar4;
  int *piVar5;
  float fVar6;
  float fVar7;
  
  if (p->vSwitching == (Vec_Int_t *)0x0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = p->vSwitching->pArray;
  }
  iVar1 = pObj->nRefs;
  pObj->nRefs = iVar1 + 1;
  fVar7 = 0.0;
  if ((iVar1 == 0) && (fVar7 = 0.0, 1 < (*(uint *)pObj & 0xf) - 1)) {
    if ((*(uint *)pObj & 0xf) != 4) {
      __assert_fail("If_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifUtil.c"
                    ,0x19a,"float If_ManMarkMapping_rec(If_Man_t *, If_Obj_t *)");
    }
    p->nNets = p->nNets + (uint)(byte)(pObj->CutBest).field_0x1f;
    uVar3 = *(uint *)&(pObj->CutBest).field_0x1c;
    if ((short)uVar3 < 0) {
      fVar7 = (float)p->pPars->nAndArea;
    }
    else if ((uVar3 >> 0xd & 1) == 0) {
      pIVar2 = p->pPars->pLutLib;
      if (pIVar2 == (If_LibLut_t *)0x0) {
        fVar7 = 1.0;
      }
      else {
        fVar7 = pIVar2->pLutAreas[uVar3 >> 0x18];
      }
    }
    else {
      fVar7 = (float)(uVar3 & 0xfff);
    }
    uVar4 = 0;
    while ((uVar4 < uVar3 >> 0x18 &&
           (pObj_00 = If_ManObj(p,*(int *)(&pObj[1].field_0x0 + uVar4 * 4)),
           pObj_00 != (If_Obj_t *)0x0))) {
      if (piVar5 == (int *)0x0) {
        fVar6 = 0.0;
      }
      else {
        fVar6 = (float)piVar5[pObj_00->Id];
      }
      p->dPower = p->dPower + fVar6;
      fVar6 = If_ManMarkMapping_rec(p,pObj_00);
      fVar7 = fVar7 + fVar6;
      uVar4 = uVar4 + 1;
      uVar3 = *(uint *)&(pObj->CutBest).field_0x1c;
    }
  }
  return fVar7;
}

Assistant:

float If_ManMarkMapping_rec( If_Man_t * p, If_Obj_t * pObj )
{
    If_Obj_t * pLeaf;
    If_Cut_t * pCutBest;
    float * pSwitching = p->vSwitching? (float*)p->vSwitching->pArray : NULL;
    float aArea;
    int i;
    if ( pObj->nRefs++ || If_ObjIsCi(pObj) || If_ObjIsConst1(pObj) )
        return 0.0;
    // store the node in the structure by level
    assert( If_ObjIsAnd(pObj) );
    // visit the transitive fanin of the selected cut
    pCutBest = If_ObjCutBest(pObj);
    p->nNets += pCutBest->nLeaves;
    aArea = If_CutLutArea( p, pCutBest );
    If_CutForEachLeaf( p, pCutBest, pLeaf, i )
    {
        p->dPower += pSwitching? pSwitching[pLeaf->Id] : 0.0;
        aArea += If_ManMarkMapping_rec( p, pLeaf );
    }
    return aArea;
}